

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O1

SMBusByte * __thiscall SMBusByte::ToDataByte(SMBusByte *this,SMBusFrameType frame_type)

{
  undefined8 uVar1;
  byte *pbVar2;
  U8 in_DL;
  undefined4 in_register_00000034;
  
  pbVar2 = (byte *)CONCAT44(in_register_00000034,frame_type);
  Frame::Frame((Frame *)this);
  this[1].value = in_DL;
  uVar1 = **(undefined8 **)(pbVar2 + 8);
  this->value = (char)uVar1;
  this->is_acked = (bool)(char)((ulong)uVar1 >> 8);
  *(int6 *)&this->field_0x2 = (int6)((ulong)uVar1 >> 0x10);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(*(long *)(pbVar2 + 0x10) + -0x20);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(ulong)*pbVar2;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this[1].is_acked = false;
  this[1].is_acked = (bool)pbVar2[1];
  return this;
}

Assistant:

Frame SMBusByte::ToDataByte( SMBusFrameType frame_type ) const
{
    Frame f;

    f.mType = frame_type;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = signals.back().sample_end;
    f.mData1 = value;
    f.mData2 = 0;
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    return f;
}